

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O3

void comment_end_fun(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  MYSQL *pMVar5;
  char query [4608];
  char acStack_1228 [4608];
  
  pcVar2 = strchr(argument,0x22);
  if (pcVar2 != (char *)0x0) {
    send_to_char("Error:  Your comment contained a double-quotation mark.  You must use single quotes to prevent errors.\n\r"
                 ,ch);
    return;
  }
  pcVar3 = escape_string(argument);
  pcVar2 = ch->true_name;
  sVar1 = ch->pcdata->helpid;
  pcVar4 = log_time();
  sprintf(acStack_1228,"INSERT INTO sitecomments VALUES(%d, nullptr, \"%s\", \"%s\", \"%s\")",
          (ulong)(uint)(int)sVar1,pcVar2,pcVar4,pcVar3);
  pMVar5 = open_conn();
  mysql_query(pMVar5,acStack_1228);
  mysql_close(pMVar5);
  sprintf(acStack_1228,"Your comment was added.  Use sitetrack %d to view your comments.\n\r",
          (ulong)(uint)(int)ch->pcdata->helpid);
  send_to_char(acStack_1228,ch);
  *ch->pcdata->entered_text = '\0';
  return;
}

Assistant:

void comment_end_fun(CHAR_DATA *ch, char *argument)
{
	char query[MSL];
	char *escape;

	if (strstr(argument, "\""))
	{
		send_to_char("Error:  Your comment contained a double-quotation mark.  You must use single quotes to prevent errors.\n\r", ch);
		return;
	}

	escape = escape_string(argument);
	sprintf(query, "INSERT INTO sitecomments VALUES(%d, nullptr, \"%s\", \"%s\", \"%s\")",
		ch->pcdata->helpid,
		ch->true_name,
		log_time(),
		escape);
	one_query(query);

	sprintf(query, "Your comment was added.  Use sitetrack %d to view your comments.\n\r", ch->pcdata->helpid);
	send_to_char(query, ch);
	ch->pcdata->entered_text[0] = '\0';
}